

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O3

void __thiscall Book::printProperties(Book *this)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Book Author: ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->author)._M_dataplus._M_p,
                      (this->author)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Book Publisher: ",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->publisher)._M_dataplus._M_p,
                      (this->publisher)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Book Page: ",0xb);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->page);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Book::printProperties() {
	cout << "Book Author: " << author << endl;
	cout << "Book Publisher: " << publisher << endl;
	cout << "Book Page: " << page << endl;
}